

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf.cxx
# Opt level: O1

void __thiscall xray_re::xr_ogf::~xr_ogf(xr_ogf *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppxVar2;
  pointer puVar3;
  pointer pcVar4;
  pointer ppxVar5;
  
  (this->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory =
       (_func_int **)&PTR__xr_ogf_002490c8;
  ppxVar2 = (this->m_children).
            super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppxVar5 = (this->m_children).
                 super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppxVar5 != ppxVar2; ppxVar5 = ppxVar5 + 1) {
    if (*ppxVar5 != (xr_ogf *)0x0) {
      (*((*ppxVar5)->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[1])();
    }
  }
  ppxVar2 = (this->m_lods).super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppxVar5 = (this->m_lods).
                 super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppxVar5 != ppxVar2; ppxVar5 = ppxVar5 + 1) {
    if (*ppxVar5 != (xr_ogf *)0x0) {
      (*((*ppxVar5)->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[1])();
    }
  }
  ppxVar5 = (this->m_lods).super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppxVar5 != (pointer)0x0) {
    operator_delete(ppxVar5,(long)(this->m_lods).
                                  super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppxVar5
                   );
  }
  puVar3 = (this->m_children_l).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)(this->m_children_l).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
  }
  ppxVar5 = (this->m_children).
            super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppxVar5 != (pointer)0x0) {
    operator_delete(ppxVar5,(long)(this->m_children).
                                  super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppxVar5
                   );
  }
  xr_ibuf::~xr_ibuf(&this->m_ib);
  xr_vbuf::~xr_vbuf(&this->m_vb);
  pcVar4 = (this->m_shader)._M_dataplus._M_p;
  paVar1 = &(this->m_shader).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->m_texture)._M_dataplus._M_p;
  paVar1 = &(this->m_texture).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->m_path)._M_dataplus._M_p;
  paVar1 = &(this->m_path).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  xr_object::~xr_object(&this->super_xr_object);
  return;
}

Assistant:

xr_ogf::~xr_ogf()
{
	delete_elements(m_children);
	delete_elements(m_lods);
}